

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O3

void __thiscall zsummer::log4z::CLogerManager::PushLog(CLogerManager *this)

{
  char *in_RCX;
  int in_EDX;
  LoggerId in_ESI;
  
  PushLog((CLogerManager *)&this[-1].m_ullStatusTotalPushLog,in_ESI,in_EDX,in_RCX);
  return;
}

Assistant:

bool PushLog(LoggerId id, int level, const char * log)
	{
		if (id < 0 || id >= LOG4Z_LOGGER_MAX)
		{
			return false;
		}
		if (!m_bRuning || !m_loggers[id]._enable)
		{
			return false;
		}
		if (level < m_loggers[id]._level)
		{
			return true;
		}

		LogData * pLog = new LogData;
		pLog->_id =id;
		pLog->_level = level;

		{
#ifdef WIN32
			FILETIME ft;
			GetSystemTimeAsFileTime(&ft);
			unsigned long long now = ft.dwHighDateTime;
			now <<= 32;
			now |= ft.dwLowDateTime;
			now /=10;
			now -=11644473600000000ULL;
			now /=1000;
			pLog->_time = now/1000;
			pLog->_precise = (unsigned int)(now%1000);
#else
			struct timeval tm;
			gettimeofday(&tm, NULL);
			pLog->_time = tm.tv_sec;
			pLog->_precise = tm.tv_usec/1000;
#endif
		}

		if (m_loggers[pLog->_id]._display && LOG4Z_SYNCHRONOUS_DISPLAY)
		{
			tm tt;
			if (!TimeToTm(pLog->_time, &tt))
			{
				memset(&tt, 0, sizeof(tt));
			}
			std::string text;
			sprintf(pLog->_content, "%d-%02d-%02d %02d:%02d:%02d.%03d %s ",
				tt.tm_year+1900, tt.tm_mon+1, tt.tm_mday, tt.tm_hour, tt.tm_min, tt.tm_sec, pLog->_precise,
				LOG_STRING[pLog->_level]);
			text = pLog->_content;
			text += log;
			text += " \r\n";
			ShowColorText(text.c_str(), pLog->_level);
		}

		int len = (int) strlen(log);
		if (len >= LOG4Z_LOG_BUF_SIZE)
		{
			memcpy(pLog->_content, log, LOG4Z_LOG_BUF_SIZE);
			pLog->_content[LOG4Z_LOG_BUF_SIZE-1] = '\0';
		}
		else
		{
			memcpy(pLog->_content, log, len+1);
		}
		CAutoLock l(m_lock);
		m_logs.push_back(pLog);
		m_ullStatusTotalPushLog ++;
		return true;
	}